

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::next(Session *this,Message *message,UtcTimeStamp *now,bool queued)

{
  FieldBase *this_00;
  bool bVar1;
  uint uVar2;
  FieldNotFound *pFVar3;
  StringField *rhs;
  UnsupportedVersion *this_01;
  string *psVar4;
  BeginString *beginString_00;
  uchar *in_R8;
  size_t in_R9;
  UtcTimeStamp local_610 [3];
  MessageParseError *e;
  exception *e_14;
  RequiredTagMissing *e_1;
  exception *e_16;
  exception *e_15;
  FieldNotFound *e_2;
  exception *e_17;
  InvalidTagNumber *e_3;
  exception *e_18;
  NoTagValue *e_4;
  exception *e_19;
  TagNotDefinedForMessage *e_5;
  exception *e_20;
  InvalidMessageType *anon_var_0;
  exception *e_22;
  exception *e_21;
  UnsupportedMessageType *anon_var_0_1;
  exception *e_23;
  TagOutOfOrder *e_6;
  exception *e_24;
  IncorrectDataFormat *e_7;
  exception *e_25;
  IncorrectTagValue *e_8;
  exception *e_26;
  RepeatedTag *e_9;
  exception *e_27;
  RepeatingGroupCountMismatch *e_10;
  InvalidMessage *e_11;
  RejectLogon *e_12;
  UnsupportedVersion *anon_var_0_2;
  IOException *e_13;
  DataDictionary *applicationDataDictionary;
  ApplVerID applVerID_1;
  DataDictionary *sessionDataDictionary;
  FieldBase *local_d0;
  DefaultApplVerID *applVerID;
  string local_c0;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  undefined1 local_72;
  allocator<char> local_71;
  string local_70;
  FieldBase *local_50;
  BeginString *beginString;
  MsgType *msgType;
  FieldMap *local_30;
  Header *header;
  UtcTimeStamp *pUStack_20;
  bool queued_local;
  UtcTimeStamp *now_local;
  Message *message_local;
  Session *this_local;
  
  header._7_1_ = queued;
  pUStack_20 = now;
  now_local = (UtcTimeStamp *)message;
  message_local = (Message *)this;
  local_30 = &Message::getHeader(message)->super_FieldMap;
  bVar1 = checkSessionTime(this,pUStack_20);
  if (bVar1) {
    beginString = (BeginString *)FieldMap::getFieldRef(local_30,0x23);
    local_50 = FieldMap::getFieldRef(local_30,8);
    bVar1 = FieldMap::isSetField(local_30,0x31);
    if (!bVar1) {
      local_72 = 1;
      pFVar3 = (FieldNotFound *)__cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
      FieldNotFound::FieldNotFound(pFVar3,0x31,&local_70);
      local_72 = 0;
      __cxa_throw(pFVar3,&FieldNotFound::typeinfo,FieldNotFound::~FieldNotFound);
    }
    bVar1 = FieldMap::isSetField(local_30,0x38);
    this_00 = local_50;
    if (!bVar1) {
      local_9a = 1;
      pFVar3 = (FieldNotFound *)__cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
      FieldNotFound::FieldNotFound(pFVar3,0x38,&local_98);
      local_9a = 0;
      __cxa_throw(pFVar3,&FieldNotFound::typeinfo,FieldNotFound::~FieldNotFound);
    }
    rhs = &SessionID::getBeginString(&this->m_sessionID)->super_StringField;
    bVar1 = StringField::operator!=((StringField *)this_00,rhs);
    if (bVar1) {
      applVerID._6_1_ = 1;
      this_01 = (UnsupportedVersion *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"",(allocator<char> *)((long)&applVerID + 7));
      UnsupportedVersion::UnsupportedVersion(this_01,&local_c0);
      applVerID._6_1_ = 0;
      __cxa_throw(this_01,&UnsupportedVersion::typeinfo,UnsupportedVersion::~UnsupportedVersion);
    }
    bVar1 = FIX::operator==(&beginString->super_StringField,"A");
    if (bVar1) {
      bVar1 = SessionID::isFIXT(&this->m_sessionID);
      if (bVar1) {
        local_d0 = FieldMap::getFieldRef((FieldMap *)now_local,0x471);
        psVar4 = StringField::operator_cast_to_string_((StringField *)local_d0);
        setTargetDefaultApplVerID(this,psVar4);
      }
      else {
        Message::toApplVerID((ApplVerID *)&sessionDataDictionary,(BeginString *)local_50);
        psVar4 = StringField::operator_cast_to_string_((StringField *)&sessionDataDictionary);
        setTargetDefaultApplVerID(this,psVar4);
        ApplVerID::~ApplVerID((ApplVerID *)&sessionDataDictionary);
      }
    }
    beginString_00 = SessionID::getBeginString(&this->m_sessionID);
    applVerID_1.super_StringField.super_FieldBase.m_metrics =
         (field_metrics)
         DataDictionaryProvider::getSessionDataDictionary
                   (&this->m_dataDictionaryProvider,beginString_00);
    bVar1 = SessionID::isFIXT(&this->m_sessionID);
    if ((bVar1) && (bVar1 = Message::isApp((Message *)now_local), bVar1)) {
      ApplVerID::ApplVerID((ApplVerID *)&applicationDataDictionary,&this->m_targetDefaultApplVerID);
      FieldMap::getFieldIfSet(local_30,(FieldBase *)&applicationDataDictionary);
      e_13 = (IOException *)
             DataDictionaryProvider::getApplicationDataDictionary
                       (&this->m_dataDictionaryProvider,(ApplVerID *)&applicationDataDictionary);
      DataDictionary::validate
                ((Message *)now_local,
                 (DataDictionary *)applVerID_1.super_StringField.super_FieldBase.m_metrics,
                 (DataDictionary *)e_13);
      ApplVerID::~ApplVerID((ApplVerID *)&applicationDataDictionary);
    }
    else {
      DataDictionary::validate
                ((DataDictionary *)applVerID_1.super_StringField.super_FieldBase.m_metrics,
                 (Message *)now_local);
    }
    bVar1 = FIX::operator==(&beginString->super_StringField,"A");
    if (bVar1) {
      nextLogon(this,(Message *)now_local,pUStack_20);
    }
    else {
      bVar1 = FIX::operator==(&beginString->super_StringField,"0");
      if (bVar1) {
        nextHeartbeat(this,(Message *)now_local,pUStack_20);
      }
      else {
        bVar1 = FIX::operator==(&beginString->super_StringField,"1");
        if (bVar1) {
          nextTestRequest(this,(Message *)now_local,pUStack_20);
        }
        else {
          bVar1 = FIX::operator==(&beginString->super_StringField,"4");
          if (bVar1) {
            nextSequenceReset(this,(Message *)now_local,pUStack_20);
          }
          else {
            bVar1 = FIX::operator==(&beginString->super_StringField,"5");
            if (bVar1) {
              nextLogout(this,(Message *)now_local,pUStack_20);
            }
            else {
              bVar1 = FIX::operator==(&beginString->super_StringField,"2");
              if (bVar1) {
                nextResendRequest(this,(Message *)now_local,pUStack_20);
              }
              else {
                bVar1 = FIX::operator==(&beginString->super_StringField,"3");
                if (bVar1) {
                  nextReject(this,(Message *)now_local,pUStack_20);
                }
                else {
                  uVar2 = verify(this,(EVP_PKEY_CTX *)now_local,(uchar *)0x1,1,in_R8,in_R9);
                  if ((uVar2 & 1) == 0) {
                    return;
                  }
                  SessionState::incrNextTargetMsgSeqNum(&this->m_state);
                }
              }
            }
          }
        }
      }
    }
    if ((header._7_1_ & 1) == 0) {
      nextQueued(this,pUStack_20);
    }
    bVar1 = isLoggedOn(this);
    if (bVar1) {
      std::function<FIX::UtcTimeStamp_()>::operator()(local_610,&this->m_timestamper);
      next(this,local_610);
      UtcTimeStamp::~UtcTimeStamp(local_610);
    }
  }
  else {
    reset(this);
  }
  return;
}

Assistant:

void Session::next(const Message &message, const UtcTimeStamp &now, bool queued) {
  const Header &header = message.getHeader();

  try {
    if (!checkSessionTime(now)) {
      reset();
      return;
    }

    const MsgType &msgType = FIELD_GET_REF(header, MsgType);
    const BeginString &beginString = FIELD_GET_REF(header, BeginString);
    // make sure these fields are present
    FIELD_THROW_IF_NOT_FOUND(header, SenderCompID);
    FIELD_THROW_IF_NOT_FOUND(header, TargetCompID);

    if (beginString != m_sessionID.getBeginString()) {
      throw UnsupportedVersion();
    }

    if (msgType == MsgType_Logon) {
      if (m_sessionID.isFIXT()) {
        const DefaultApplVerID &applVerID = FIELD_GET_REF(message, DefaultApplVerID);
        setTargetDefaultApplVerID(applVerID);
      } else {
        setTargetDefaultApplVerID(Message::toApplVerID(beginString));
      }
    }

    const DataDictionary &sessionDataDictionary
        = m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());

    if (m_sessionID.isFIXT() && message.isApp()) {
      ApplVerID applVerID = m_targetDefaultApplVerID;
      header.getFieldIfSet(applVerID);
      const DataDictionary &applicationDataDictionary
          = m_dataDictionaryProvider.getApplicationDataDictionary(applVerID);
      DataDictionary::validate(message, &sessionDataDictionary, &applicationDataDictionary);
    } else {
      sessionDataDictionary.validate(message);
    }

    if (msgType == MsgType_Logon) {
      nextLogon(message, now);
    } else if (msgType == MsgType_Heartbeat) {
      nextHeartbeat(message, now);
    } else if (msgType == MsgType_TestRequest) {
      nextTestRequest(message, now);
    } else if (msgType == MsgType_SequenceReset) {
      nextSequenceReset(message, now);
    } else if (msgType == MsgType_Logout) {
      nextLogout(message, now);
    } else if (msgType == MsgType_ResendRequest) {
      nextResendRequest(message, now);
    } else if (msgType == MsgType_Reject) {
      nextReject(message, now);
    } else {
      if (!verify(message)) {
        return;
      }
      m_state.incrNextTargetMsgSeqNum();
    }
  } catch (MessageParseError &e) {
    m_state.onEvent(e.what());
  } catch (RequiredTagMissing &e) {
    LOGEX(generateReject(message, SessionRejectReason_REQUIRED_TAG_MISSING, e.field));
  } catch (FieldNotFound &e) {
    if (header.getField(FIELD::BeginString) >= FIX::BeginString_FIX42 && message.isApp()) {
      LOGEX(generateBusinessReject(message, BusinessRejectReason_CONDITIONALLY_REQUIRED_FIELD_MISSING, e.field));
    } else {
      LOGEX(generateReject(message, SessionRejectReason_REQUIRED_TAG_MISSING, e.field));
      if (header.getField(FIELD::MsgType) == MsgType_Logon) {
        m_state.onEvent("Required field missing from logon");
        disconnect();
      }
    }
  } catch (InvalidTagNumber &e) {
    LOGEX(generateReject(message, SessionRejectReason_INVALID_TAG_NUMBER, e.field));
  } catch (NoTagValue &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_SPECIFIED_WITHOUT_A_VALUE, e.field));
  } catch (TagNotDefinedForMessage &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_NOT_DEFINED_FOR_THIS_MESSAGE_TYPE, e.field));
  } catch (InvalidMessageType &) {
    LOGEX(generateReject(message, SessionRejectReason_INVALID_MSGTYPE));
  } catch (UnsupportedMessageType &) {
    if (header.getField(FIELD::BeginString) >= FIX::BeginString_FIX42) {
      LOGEX(generateBusinessReject(message, BusinessRejectReason_UNSUPPORTED_MESSAGE_TYPE));
    } else {
      LOGEX(generateReject(message, "Unsupported message type"));
    }
  } catch (TagOutOfOrder &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_SPECIFIED_OUT_OF_REQUIRED_ORDER, e.field));
  } catch (IncorrectDataFormat &e) {
    LOGEX(generateReject(message, SessionRejectReason_INCORRECT_DATA_FORMAT_FOR_VALUE, e.field));
  } catch (IncorrectTagValue &e) {
    LOGEX(generateReject(message, SessionRejectReason_VALUE_IS_INCORRECT, e.field));
  } catch (RepeatedTag &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_APPEARS_MORE_THAN_ONCE, e.field));
  } catch (RepeatingGroupCountMismatch &e) {
    LOGEX(generateReject(message, SessionRejectReason_INCORRECT_NUMINGROUP_COUNT_FOR_REPEATING_GROUP, e.field));
  } catch (InvalidMessage &e) {
    m_state.onEvent(e.what());
  } catch (RejectLogon &e) {
    m_state.onEvent(e.what());
    generateLogout(e.what());
    disconnect();
  } catch (UnsupportedVersion &) {
    if (header.getField(FIELD::MsgType) == MsgType_Logout) {
      nextLogout(message, now);
    } else {
      generateLogout("Incorrect BeginString");
      m_state.incrNextTargetMsgSeqNum();
    }
  } catch (IOException &e) {
    m_state.onEvent(e.what());
    disconnect();
  }

  if (!queued) {
    nextQueued(now);
  }

  if (isLoggedOn()) {
    next(m_timestamper());
  }
}